

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  TestCaseInfo *_testInfo;
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer pIVar4;
  SectionTracker *pSVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  byte local_262;
  TestCaseStats local_218;
  NameAndLocation local_e8;
  SectionTracker *local_b8;
  ITracker *rootTracker;
  TestCaseInfo *local_a0;
  TestCaseInfo *testInfo;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  TestCase *testCase_local;
  RunContext *this_local;
  
  redirectedCout.field_2._8_8_ = *(undefined8 *)&this->m_totals;
  std::__cxx11::string::string((string *)(redirectedCerr.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&testInfo);
  local_a0 = TestCase::getTestCaseInfo(testCase);
  pIVar4 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  (*pIVar4->_vptr_IStreamingReporter[7])(pIVar4,local_a0);
  this->m_activeTestCase = testCase;
  pSVar5 = (SectionTracker *)TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
  local_b8 = pSVar5;
  peVar6 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_config);
  iVar2 = (*(peVar6->super_NonCopyable)._vptr_NonCopyable[0x13])();
  TestCaseTracking::SectionTracker::addInitialFilters
            (pSVar5,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(extraout_var,iVar2));
  do {
    TestCaseTracking::TrackerContext::startCycle(&this->m_trackerContext);
    TestCaseTracking::NameAndLocation::NameAndLocation
              (&local_e8,&local_a0->name,&local_a0->lineInfo);
    pSVar5 = TestCaseTracking::SectionTracker::acquire(&this->m_trackerContext,&local_e8);
    this->m_testCaseTracker = (ITracker *)pSVar5;
    TestCaseTracking::NameAndLocation::~NameAndLocation(&local_e8);
    runCurrentTest(this,(string *)((long)&redirectedCerr.field_2 + 8),(string *)&testInfo);
    uVar3 = (*this->m_testCaseTracker->_vptr_ITracker[3])();
    local_262 = 0;
    if ((uVar3 & 1) == 0) {
      bVar1 = aborting(this);
      local_262 = bVar1 ^ 0xff;
    }
  } while ((local_262 & 1) != 0);
  Totals::delta(__return_storage_ptr__,&this->m_totals,(Totals *)((long)&redirectedCout.field_2 + 8)
               );
  bVar1 = TestCaseInfo::expectedToFail(local_a0);
  if ((bVar1) && ((__return_storage_ptr__->testCases).passed != 0)) {
    (__return_storage_ptr__->assertions).failed = (__return_storage_ptr__->assertions).failed + 1;
    (__return_storage_ptr__->testCases).passed = (__return_storage_ptr__->testCases).passed - 1;
    (__return_storage_ptr__->testCases).failed = (__return_storage_ptr__->testCases).failed + 1;
  }
  Counts::operator+=(&(this->m_totals).testCases,&__return_storage_ptr__->testCases);
  pIVar4 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  _testInfo = local_a0;
  bVar1 = aborting(this);
  TestCaseStats::TestCaseStats
            (&local_218,_testInfo,__return_storage_ptr__,
             (string *)((long)&redirectedCerr.field_2 + 8),(string *)&testInfo,bVar1);
  (*pIVar4->_vptr_IStreamingReporter[0xc])(pIVar4,&local_218);
  TestCaseStats::~TestCaseStats(&local_218);
  this->m_activeTestCase = (TestCase *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  std::__cxx11::string::~string((string *)&testInfo);
  std::__cxx11::string::~string((string *)(redirectedCerr.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

Totals RunContext::runTest(TestCase const& testCase) {
        Totals prevTotals = m_totals;

        std::string redirectedCout;
        std::string redirectedCerr;

        auto const& testInfo = testCase.getTestCaseInfo();

        m_reporter->testCaseStarting(testInfo);

        m_activeTestCase = &testCase;

        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(testInfo.name, testInfo.lineInfo));
            runCurrentTest(redirectedCout, redirectedCerr);
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
            deltaTotals,
            redirectedCout,
            redirectedCerr,
            aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }